

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O0

uint32_t utf8::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        end)

{
  utf_error uVar1;
  not_enough_room *this;
  invalid_utf8 *this_00;
  uint8_t *puVar2;
  invalid_code_point *this_01;
  uint32_t local_1c;
  utf_error err_code;
  uint32_t cp;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  
  local_1c = 0;
  _err_code = it;
  it_local = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)end._M_current;
  uVar1 = internal::validate_next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (it,end,&local_1c);
  switch(uVar1) {
  case UTF8_OK:
    break;
  case NOT_ENOUGH_ROOM:
    this = (not_enough_room *)__cxa_allocate_exception(8);
    memset(this,0,8);
    not_enough_room::not_enough_room(this);
    __cxa_throw(this,&not_enough_room::typeinfo,not_enough_room::~not_enough_room);
  case INVALID_LEAD:
  case INCOMPLETE_SEQUENCE:
  case OVERLONG_SEQUENCE:
    this_00 = (invalid_utf8 *)__cxa_allocate_exception(0x10);
    puVar2 = (uint8_t *)
             __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(_err_code);
    invalid_utf8::invalid_utf8(this_00,*puVar2);
    __cxa_throw(this_00,&invalid_utf8::typeinfo,invalid_utf8::~invalid_utf8);
  case INVALID_CODE_POINT:
    this_01 = (invalid_code_point *)__cxa_allocate_exception(0x10);
    invalid_code_point::invalid_code_point(this_01,local_1c);
    __cxa_throw(this_01,&invalid_code_point::typeinfo,invalid_code_point::~invalid_code_point);
  }
  return local_1c;
}

Assistant:

uint32_t next(octet_iterator& it, octet_iterator end)
    {
        uint32_t cp = 0;
        internal::utf_error err_code = utf8::internal::validate_next(it, end, cp);
        switch (err_code) {
            case internal::UTF8_OK :
                break;
            case internal::NOT_ENOUGH_ROOM :
                throw not_enough_room();
            case internal::INVALID_LEAD :
            case internal::INCOMPLETE_SEQUENCE :
            case internal::OVERLONG_SEQUENCE :
                throw invalid_utf8(*it);
            case internal::INVALID_CODE_POINT :
                throw invalid_code_point(cp);
        }
        return cp;
    }